

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O0

int mainMenu(ifstream *loadFile,ofstream *compressedFile,ofstream *mapper)

{
  code *pcVar1;
  ofstream *mapper_00;
  ofstream *compressedFile_00;
  ofstream *loadFile_00;
  ostream *poVar2;
  string local_f8 [32];
  string local_d8 [8];
  string folderName_1;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [8];
  string fileName;
  string local_48 [8];
  string folderName;
  int local_24;
  ofstream *poStack_20;
  int userChoice;
  ofstream *mapper_local;
  ofstream *compressedFile_local;
  ifstream *loadFile_local;
  
  poStack_20 = mapper;
  mapper_local = compressedFile;
  compressedFile_local = (ofstream *)loadFile;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Welcome to Pied Piper the brand new middle out compression engine");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Please select what you would like to do...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"1) Compress File");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"2) Decompress File");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"3) Close Program and install virus");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_24 = 0;
  std::istream::operator>>((istream *)&std::cin,&local_24);
  if (local_24 == 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Please enter the folder path to where you would like to save .pra file..."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_48);
    std::operator>>((istream *)&std::cin,local_48);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Please enter directory of file with file name...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_78);
    std::operator>>((istream *)&std::cin,local_78);
    loadFile_00 = compressedFile_local;
    compressedFile_00 = mapper_local;
    mapper_00 = poStack_20;
    std::__cxx11::string::string(local_98,local_48);
    std::__cxx11::string::string(local_b8,local_78);
    initalizeFiles((ifstream *)loadFile_00,compressedFile_00,mapper_00,(string *)local_98,
                   (string *)local_b8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_98);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"COMPRESSING.....");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    preCompress((ifstream *)compressedFile_local,mapper_local);
    compressor((ifstream *)compressedFile_local,mapper_local,poStack_20);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_48);
  }
  else if (local_24 == 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Please enter the path of the folder containing the .pra mapper and compressed file"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_d8);
    std::operator>>((istream *)&std::cin,local_d8);
    std::__cxx11::string::string(local_f8,local_d8);
    decompress((string *)local_f8);
    std::__cxx11::string::~string(local_f8);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"DECOMPRESSING...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_d8);
  }
  else {
    if (local_24 == 3) {
      return 0;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Not a valid choice pick again...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int mainMenu(ifstream &loadFile, ofstream &compressedFile, ofstream &mapper)
{

    // Display user cmd line interface for selection if they want to compress or decmopress or close programm
    cout << "Welcome to Pied Piper the brand new middle out compression engine"<< endl;
    cout << "Please select what you would like to do..."<< endl;
    cout << "1) Compress File" << endl;
    cout << "2) Decompress File" <<endl;
    cout << "3) Close Program and install virus"<<endl;

    // Take in user input
    int userChoice = 0;
    cin >> userChoice;

    // Check agianst choices
    if (userChoice == 1)
    {
        // Compress File

        // If compressing take in the folder they want the .pra files stored I recommend a folder called Compressed
        cout << "Please enter the folder path to where you would like to save .pra file..." <<endl;
        string folderName;
        cin >> folderName;

        // Ask the user to enter the path to the source file they want to try and compress

        cout << "Please enter directory of file with file name..." <<endl;
        string fileName;
        cin >> fileName;


        // Initialize the fstreams based on the values passed in by the user
        initalizeFiles(loadFile, compressedFile, mapper, folderName, fileName);

        cout << endl; // Display cleanup

        // Inform the user compression is starting
        // TODO: Add progress bar
        cout << "COMPRESSING....."<<endl;

        // Parse through the file once looking for unique words and saving the top three used with corresponding single
        // byte representations
        preCompress(loadFile, compressedFile);

        // Parse through file a second time this time looking for any word matching the top three from preCompression
        // and replacing them with the single byte mapping
        compressor(loadFile, compressedFile, mapper);


    }
    else if (userChoice == 2)
    {
        // Decompress File
        // If Decompressing have user enter folder of .pra files
        cout << "Please enter the path of the folder containing the .pra mapper and compressed file"<<endl;
        string folderName;
        cin >> folderName;

        // Run decopression saving a new decmopressed file in the same folder as the main.cpp file and call it
        // Decmpressed.txt
        // TODO: Change save directory to compressed .pra folder and resave as original source file name

        decompress(folderName);

        // Inform the user its decompressing their file
        cout << endl;

        cout << "DECOMPRESSING..." <<endl;
    }
    else if (userChoice == 3)
    {
        // Close the program

        return 0;

    }
    else
    {
        // User did not select 1-3
        cerr << "Not a valid choice pick again..." <<endl;

    }
}